

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void rhash_sha1_process_block(uint *hash,uint *block)

{
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  long lVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [3];
  undefined4 uStack_178;
  char local_174 [4];
  undefined4 uStack_170;
  char acStack_16c [20];
  uint auStack_158 [74];
  
  lVar28 = 0;
  do {
    auVar37 = *(undefined1 (*) [16])(block + lVar28);
    auVar38[1] = 0;
    auVar38[0] = auVar37[8];
    auVar38[2] = auVar37[9];
    auVar38[3] = 0;
    auVar38[4] = auVar37[10];
    auVar38[5] = 0;
    auVar38[6] = auVar37[0xb];
    auVar38[7] = 0;
    auVar38[8] = auVar37[0xc];
    auVar38[9] = 0;
    auVar38[10] = auVar37[0xd];
    auVar38[0xb] = 0;
    auVar38[0xc] = auVar37[0xe];
    auVar38[0xd] = 0;
    auVar38[0xe] = auVar37[0xf];
    auVar38[0xf] = 0;
    auVar38 = pshuflw(auVar38,auVar38,0x1b);
    auVar38 = pshufhw(auVar38,auVar38,0x1b);
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar37._0_13_;
    auVar18[0xe] = auVar37[7];
    auVar19[0xc] = auVar37[6];
    auVar19._0_12_ = auVar37._0_12_;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar37._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar21[10] = auVar37[5];
    auVar21._0_10_ = auVar37._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar37._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    auVar23[8] = auVar37[4];
    auVar23._0_8_ = auVar37._0_8_;
    auVar23._9_6_ = auVar22._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar23._8_7_;
    auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar26[0] = auVar37[3];
    auVar26._9_6_ = 0;
    auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar27[0] = auVar37[2];
    auVar27._11_4_ = 0;
    auVar24[2] = auVar37[1];
    auVar24._0_2_ = auVar37._0_2_;
    auVar24._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar37._0_2_ = auVar37._0_2_ & 0xff;
    auVar37._2_13_ = auVar24._2_13_;
    auVar37[0xf] = 0;
    auVar37 = pshuflw(auVar37,auVar37,0x1b);
    auVar37 = pshufhw(auVar37,auVar37,0x1b);
    sVar2 = auVar37._0_2_;
    sVar3 = auVar37._2_2_;
    sVar4 = auVar37._4_2_;
    sVar5 = auVar37._6_2_;
    sVar6 = auVar37._8_2_;
    sVar7 = auVar37._10_2_;
    sVar8 = auVar37._12_2_;
    sVar9 = auVar37._14_2_;
    sVar10 = auVar38._0_2_;
    sVar11 = auVar38._2_2_;
    sVar12 = auVar38._4_2_;
    sVar13 = auVar38._6_2_;
    sVar14 = auVar38._8_2_;
    sVar15 = auVar38._10_2_;
    sVar16 = auVar38._12_2_;
    sVar17 = auVar38._14_2_;
    lVar1 = lVar28 * 4;
    local_174[lVar1 + -4] = (0 < sVar2) * (sVar2 < 0x100) * auVar37[0] - (0xff < sVar2);
    local_174[lVar1 + -3] = (0 < sVar3) * (sVar3 < 0x100) * auVar37[2] - (0xff < sVar3);
    local_174[lVar1 + -2] = (0 < sVar4) * (sVar4 < 0x100) * auVar37[4] - (0xff < sVar4);
    local_174[lVar1 + -1] = (0 < sVar5) * (sVar5 < 0x100) * auVar37[6] - (0xff < sVar5);
    local_174[lVar1] = (0 < sVar6) * (sVar6 < 0x100) * auVar37[8] - (0xff < sVar6);
    local_174[lVar1 + 1] = (0 < sVar7) * (sVar7 < 0x100) * auVar37[10] - (0xff < sVar7);
    local_174[lVar1 + 2] = (0 < sVar8) * (sVar8 < 0x100) * auVar37[0xc] - (0xff < sVar8);
    local_174[lVar1 + 3] = (0 < sVar9) * (sVar9 < 0x100) * auVar37[0xe] - (0xff < sVar9);
    acStack_16c[lVar1 + -4] = (0 < sVar10) * (sVar10 < 0x100) * auVar38[0] - (0xff < sVar10);
    acStack_16c[lVar1 + -3] = (0 < sVar11) * (sVar11 < 0x100) * auVar38[2] - (0xff < sVar11);
    acStack_16c[lVar1 + -2] = (0 < sVar12) * (sVar12 < 0x100) * auVar38[4] - (0xff < sVar12);
    acStack_16c[lVar1 + -1] = (0 < sVar13) * (sVar13 < 0x100) * auVar38[6] - (0xff < sVar13);
    *(char *)(auStack_158 + lVar28 + -5) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar38[8] - (0xff < sVar14);
    *(char *)((long)auStack_158 + lVar1 + -0x13) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar38[10] - (0xff < sVar15);
    *(char *)((long)auStack_158 + lVar1 + -0x12) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar38[0xc] - (0xff < sVar16);
    *(char *)((long)auStack_158 + lVar1 + -0x11) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar38[0xe] - (0xff < sVar17);
    lVar28 = lVar28 + 4;
  } while (lVar28 != 0x10);
  lVar28 = 0x10;
  do {
    uVar29 = auStack_198[lVar28] ^ auStack_184[lVar28] ^ auStack_1b8[lVar28 + 2] ^
             auStack_1b8[lVar28];
    *(uint *)(local_174 + lVar28 * 4 + -4) = uVar29 << 1 | (uint)((int)uVar29 < 0);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x50);
  lVar28 = 0;
  uVar29 = hash[4];
  uVar36 = hash[3];
  uVar33 = hash[2];
  uVar35 = hash[1];
  uVar34 = *hash;
  do {
    uVar30 = uVar34;
    uVar32 = uVar33;
    uVar31 = uVar36;
    uVar34 = ((uVar31 ^ uVar32) & uVar35 ^ uVar31) + (uVar30 << 5 | uVar30 >> 0x1b) + uVar29 +
             *(int *)(local_174 + lVar28 * 4 + -4) + 0x5a827999;
    uVar33 = uVar35 << 0x1e | uVar35 >> 2;
    lVar28 = lVar28 + 1;
    uVar29 = uVar31;
    uVar36 = uVar32;
    uVar35 = uVar30;
  } while (lVar28 != 0x14);
  lVar28 = 0x14;
  do {
    uVar36 = uVar32;
    uVar29 = uVar34;
    uVar32 = uVar33;
    uVar34 = (uVar32 ^ uVar30 ^ uVar36) + (uVar29 << 5 | uVar29 >> 0x1b) + uVar31 +
             *(int *)(local_174 + lVar28 * 4 + -4) + 0x6ed9eba1;
    uVar33 = uVar30 << 0x1e | uVar30 >> 2;
    lVar28 = lVar28 + 1;
    uVar30 = uVar29;
    uVar31 = uVar36;
  } while (lVar28 != 0x28);
  lVar28 = 0x28;
  do {
    uVar30 = uVar32;
    uVar35 = uVar34;
    uVar32 = uVar33;
    uVar34 = *(int *)(local_174 + lVar28 * 4 + -4) +
             (uVar30 & uVar32 | (uVar30 | uVar32) & uVar29) +
             (uVar35 << 5 | uVar35 >> 0x1b) + uVar36 + 0x8f1bbcdc;
    uVar33 = uVar29 << 0x1e | uVar29 >> 2;
    lVar28 = lVar28 + 1;
    uVar29 = uVar35;
    uVar36 = uVar30;
  } while (lVar28 != 0x3c);
  lVar28 = 0x3c;
  do {
    uVar36 = uVar32;
    uVar29 = uVar34;
    uVar32 = uVar33;
    uVar34 = (uVar32 ^ uVar35 ^ uVar36) + (uVar29 << 5 | uVar29 >> 0x1b) + uVar30 +
             *(int *)(local_174 + lVar28 * 4 + -4) + 0xca62c1d6;
    uVar33 = uVar35 << 0x1e | uVar35 >> 2;
    lVar28 = lVar28 + 1;
    uVar35 = uVar29;
    uVar30 = uVar36;
  } while (lVar28 != 0x50);
  *hash = uVar34 + *hash;
  hash[1] = uVar29 + hash[1];
  hash[2] = uVar33 + hash[2];
  hash[3] = uVar32 + hash[3];
  hash[4] = uVar36 + hash[4];
  return;
}

Assistant:

static void rhash_sha1_process_block(unsigned* hash, const unsigned* block)
{
	int           t;                 /* Loop counter */
	uint32_t      temp;              /* Temporary word value */
	uint32_t      W[80];             /* Word sequence */
	uint32_t      A, B, C, D, E;     /* Word buffers */

	/* initialize the first 16 words in the array W */
	for (t = 0; t < 16; t++) {
		/* note: it is much faster to apply be2me here, then using be32_copy */
		W[t] = be2me_32(block[t]);
	}

	/* initialize the rest */
	for (t = 16; t < 80; t++) {
		W[t] = ROTL32(W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16], 1);
	}

	A = hash[0];
	B = hash[1];
	C = hash[2];
	D = hash[3];
	E = hash[4];

	for (t = 0; t < 20; t++) {
		/* the following is faster than ((B & C) | ((~B) & D)) */
		temp =  ROTL32(A, 5) + (((C ^ D) & B) ^ D)
			+ E + W[t] + 0x5A827999;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0x6ED9EBA1;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = ROTL32(A, 5) + ((B & C) | (B & D) | (C & D))
			+ E + W[t] + 0x8F1BBCDC;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0xCA62C1D6;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	hash[0] += A;
	hash[1] += B;
	hash[2] += C;
	hash[3] += D;
	hash[4] += E;
}